

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveData.cpp
# Opt level: O3

void __thiscall CDirectiveData::writeSymData(CDirectiveData *this,SymbolData *symData)

{
  size_t sVar1;
  DataType type;
  
  type = DataAscii;
  if (this->ascii == false) {
    sVar1 = this->UnitSize;
    if (sVar1 == 1) {
      type = Data8;
    }
    else if (sVar1 == 4) {
      type = Data32;
    }
    else {
      if (sVar1 != 2) {
        return;
      }
      type = Data16;
    }
  }
  SymbolData::addData(symData,this->RamPos,this->SpaceNeeded,type);
  return;
}

Assistant:

void CDirectiveData::writeSymData(SymbolData& symData)
{
	if (ascii == true)
	{
		symData.addData(RamPos,SpaceNeeded,SymbolData::DataAscii);
	} else {
		switch (UnitSize)
		{
		case 1:
			symData.addData(RamPos,SpaceNeeded,SymbolData::Data8);
			break;
		case 2:
			symData.addData(RamPos,SpaceNeeded,SymbolData::Data16);
			break;
		case 4:
			symData.addData(RamPos,SpaceNeeded,SymbolData::Data32);
			break;
		}
	}
}